

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
Annotator_pythonBindingFunctionsCoverage_Test::TestBody
          (Annotator_pythonBindingFunctionsCoverage_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  allocator<char> local_154;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  AssertionResult gtest_ar;
  allocator<char> local_110 [32];
  AssertionResult gtest_ar_2;
  string local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  string local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  ModelPtr model;
  AnnotatorPtr annotator;
  allocator<char> local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  allocator<char> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  string local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78 [3];
  string local_60 [32];
  VariablePairPtr itemConnection;
  UnitsItemPtr itemUnitsItem;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Annotator::create();
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"units2",local_110);
  libcellml::Model::units((string *)&gtest_ar);
  libcellml::UnitsItem::create((shared_ptr *)&itemUnitsItem,(ulong)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&local_150);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"component2",local_90);
  libcellml::ComponentEntity::component((string *)&gtest_ar_2,bVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"variable1",local_a0);
  libcellml::Component::variable(local_80);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"component3",&local_153);
  libcellml::ComponentEntity::component(local_e0,bVar1);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"variable1",&local_154);
  libcellml::Component::variable(local_d0);
  libcellml::VariablePair::create((shared_ptr *)&itemConnection,(shared_ptr *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  std::__cxx11::string::~string(local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
  std::__cxx11::string::~string((string *)local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_78);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&local_150);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_150);
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"","annotator->assignId(itemUnitsItem)",
             (char (*) [1])0x153c1a,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x825,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_150);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_150,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"",
             "annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [1])0x153c1a,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x826,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_150);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  peVar2 = annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"component2",&local_153);
  libcellml::ComponentEntity::component(local_e0,bVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"variable1",&local_154);
  libcellml::Component::variable(local_d0);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>(local_60,"component3",&local_151);
  libcellml::ComponentEntity::component((string *)local_a0,bVar1);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"variable1",&local_152);
  libcellml::Component::variable((string *)local_90);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_150,(shared_ptr *)peVar2,(CellmlElementType)local_d0);
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"\"",
             "annotator->assignId(model->component(\"component2\")->variable(\"variable1\"), model->component(\"component3\")->variable(\"variable1\"))"
             ,(char (*) [1])0x153c1a,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string(local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__cxx11::string::~string(local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  std::__cxx11::string::~string((string *)local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if (gtest_ar_2.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x827,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_150);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  libcellml::Annotator::setModel
            ((shared_ptr *)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_150);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"b4da55\"","annotator->assignId(itemUnitsItem)",
             (char (*) [7])"b4da55",&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x82c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_150);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_150,
             (CellmlElementType)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"b4da56\"",
             "annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION)",
             (char (*) [7])"b4da56",&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x82d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_150);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"component2",&local_153);
  libcellml::ComponentEntity::component(local_e0,bVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"variable1",&local_154);
  libcellml::Component::variable(local_d0);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"component3",&local_151);
  libcellml::ComponentEntity::component
            ((string *)local_a0,
             (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _0_1_);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"variable1",&local_152);
  libcellml::Component::variable((string *)local_90);
  libcellml::Annotator::assignId_abi_cxx11_
            ((shared_ptr *)&local_150,
             (shared_ptr *)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (CellmlElementType)local_d0);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"b4da57\"",
             "annotator->assignId(model->component(\"component2\")->variable(\"variable1\"), model->component(\"component3\")->variable(\"variable1\"))"
             ,(char (*) [7])"b4da57",&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string(local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__cxx11::string::~string(local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  std::__cxx11::string::~string((string *)local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_150);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x82e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_150);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemConnection.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&itemUnitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, pythonBindingFunctionsCoverage)
{
    // Several functions are provided so that bindings are easier to use.
    // This test is to provide coverage for those rather than to demonstrate functionality.

    auto parser = libcellml::Parser::create();
    auto annotator = libcellml::Annotator::create();
    auto model = parser->parseModel(modelStringNoIds);

    auto itemUnitsItem = libcellml::UnitsItem::create(model->units("units2"), 0);
    auto itemConnection = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1"),
        model->component("component3")->variable("variable1"));

    // Expect failure as no model is built.
    EXPECT_EQ("", annotator->assignId(itemUnitsItem));
    EXPECT_EQ("", annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("", annotator->assignId(model->component("component2")->variable("variable1"), model->component("component3")->variable("variable1")));

    annotator->setModel(model);

    // Expect success.
    EXPECT_EQ("b4da55", annotator->assignId(itemUnitsItem));
    EXPECT_EQ("b4da56", annotator->assignId(itemConnection, libcellml::CellmlElementType::CONNECTION));
    EXPECT_EQ("b4da57", annotator->assignId(model->component("component2")->variable("variable1"), model->component("component3")->variable("variable1")));
}